

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceBitfieldInsert_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType baseDataType,DataType insertDataType,
          DataType offsetDataType,DataType bitsDataType)

{
  bool bVar1;
  RenderContext *pRVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  char *local_320;
  allocator<char> local_2f1;
  string local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  deUint32 local_1b8;
  ContextType local_1a4;
  ostringstream local_1a0 [8];
  ostringstream source;
  DataType offsetDataType_local;
  DataType insertDataType_local;
  DataType baseDataType_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  local_1a4.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_1b8 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_1a4,(ApiType)local_1b8);
  if (bVar1) {
    local_320 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_320 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar3 = std::operator<<((ostream *)local_1a0,local_320);
  poVar3 = std::operator<<(poVar3,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1d8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"base",&local_219);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_1f8,shaderType,&local_218);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
  poVar3 = std::operator<<(poVar3,"    ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"insert",&local_261);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_240,baseDataType,&local_260);
  poVar3 = std::operator<<(poVar3,(string *)&local_240);
  poVar3 = std::operator<<(poVar3,"    ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"offset",&local_2a9);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_288,insertDataType,&local_2a8);
  poVar3 = std::operator<<(poVar3,(string *)&local_288);
  poVar3 = std::operator<<(poVar3,"    ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"bits",&local_2f1);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_2d0,offsetDataType,&local_2f0);
  poVar3 = std::operator<<(poVar3,(string *)&local_2d0);
  poVar3 = std::operator<<(poVar3,"    bitfieldInsert(base, insert, offset, bits);\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceBitfieldInsert (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType baseDataType, glu::DataType insertDataType, glu::DataType offsetDataType, glu::DataType bitsDataType)
{
	std::ostringstream source;
	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< "void main(void)\n"
			<< "{\n"
			<< "    " << declareAndInitializeShaderVariable(baseDataType, "base")
			<< "    " << declareAndInitializeShaderVariable(insertDataType, "insert")
			<< "    " << declareAndInitializeShaderVariable(offsetDataType, "offset")
			<< "    " << declareAndInitializeShaderVariable(bitsDataType, "bits")
			<< "    bitfieldInsert(base, insert, offset, bits);\n"
			<< "}\n";

	return source.str();
}